

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaParseLocalAttributes
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr *child,
              xmlSchemaItemListPtr *list,int parentType,int *hasRefs)

{
  byte *pbVar1;
  xmlSchemaPtr pxVar2;
  xmlDictPtr pxVar3;
  xmlSchemaRedefPtr_conflict pxVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  xmlNodePtr pxVar8;
  char *type;
  xmlChar **str1;
  xmlSchemaAttributePtr pxVar9;
  xmlAttrPtr pxVar10;
  xmlSchemaAnnotPtr pxVar11;
  xmlSchemaItemListPtr pxVar12;
  xmlSchemaAttributePtr_conflict pxVar13;
  xmlSchemaTypePtr pxVar14;
  int iVar15;
  uint uVar16;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr pxVar17;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaTypePtr pxVar18;
  xmlParserErrors xVar19;
  long lVar20;
  undefined4 in_register_00000084;
  char *type_00;
  char *uri;
  xmlSchemaAttributeUsePtr_conflict item;
  bool bVar21;
  xmlChar *tmpNs;
  xmlChar *tmpName;
  xmlChar *name;
  char *in_stack_ffffffffffffff38;
  xmlChar *in_stack_ffffffffffffff40;
  xmlChar *in_stack_ffffffffffffff48;
  undefined1 local_a8 [68];
  int local_64;
  xmlSchemaTypePtr local_60;
  xmlSchemaPtr local_58;
  xmlNodePtr local_50;
  xmlChar *local_48;
  int local_3c;
  xmlSchemaTypePtr local_38;
  
  type_00 = (char *)CONCAT44(in_register_00000084,parentType);
  uri = (char *)hasRefs;
  pxVar11 = (xmlSchemaAnnotPtr)list;
  local_a8._40_8_ = child;
  local_a8._48_8_ = list;
  local_58 = schema;
  do {
    pxVar8 = *child;
    if ((((pxVar8 == (xmlNodePtr)0x0) || (pxVar8->ns == (xmlNs *)0x0)) ||
        (iVar6 = xmlStrEqual(pxVar8->name,"attribute"), iVar6 == 0)) ||
       (iVar6 = xmlStrEqual((*child)->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 == 0)) {
      pxVar8 = *child;
      if (pxVar8 == (xmlNodePtr)0x0) {
        return 0;
      }
      if (pxVar8->ns == (xmlNs *)0x0) {
        return 0;
      }
      iVar6 = xmlStrEqual(pxVar8->name,(xmlChar *)"attributeGroup");
      if (iVar6 == 0) {
        return 0;
      }
      iVar6 = xmlStrEqual((*child)->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (iVar6 == 0) {
        return 0;
      }
    }
    pxVar8 = *child;
    if (((pxVar8 == (xmlNodePtr)0x0) || (pxVar8->ns == (xmlNs *)0x0)) ||
       ((iVar6 = xmlStrEqual(pxVar8->name,"attribute"), iVar6 == 0 ||
        (iVar6 = xmlStrEqual((*child)->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
        iVar6 == 0)))) {
      pxVar2 = (xmlSchemaPtr)*child;
      local_a8._56_8_ = (xmlSchemaTypePtr)0x0;
      local_a8._0_8_ = (xmlSchemaTypePtr)0x0;
      item = (xmlSchemaAttributeUsePtr_conflict)0x0;
      type = (char *)list;
      if (pxVar2 != (xmlSchemaPtr)0x0) {
        pxVar8 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)pxVar2,"ref");
        if (pxVar8 == (xmlNodePtr)0x0) {
          xmlSchemaPMissingAttrErr
                    (ctxt,(xmlParserErrors)pxVar2,(xmlSchemaBasicItemPtr)0x1e18f2,(xmlNodePtr)list,
                     type_00,uri);
          item = (xmlSchemaAttributeUsePtr_conflict)0x0;
          type = (char *)list;
          pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
        }
        else {
          pxVar10 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,pxVar8);
          type_00 = local_a8 + 0x38;
          uri = local_a8;
          xmlSchemaPValAttrNodeQNameValue
                    (ctxt,local_58,(xmlSchemaBasicItemPtr)pxVar8,pxVar10,(xmlChar *)type_00,
                     (xmlChar **)uri,(xmlChar **)in_stack_ffffffffffffff38);
          type = (char *)local_a8._56_8_;
          pxVar18 = (xmlSchemaTypePtr)local_a8._56_8_;
          iVar6 = xmlSchemaCheckReference
                            (ctxt,pxVar2,pxVar8,(xmlAttrPtr)local_a8._56_8_,(xmlChar *)type_00);
          if (iVar6 == 0) {
            for (pxVar3 = (xmlDictPtr)pxVar2->notaDecl; pxVar3 != (xmlDictPtr)0x0;
                pxVar3 = (xmlDictPtr)((xmlHashTablePtr)&pxVar3->seed)->table) {
              if (pxVar3[1].table == (xmlDictEntry *)0x0) {
                iVar6 = xmlStrEqual((xmlChar *)pxVar3->size,"ref");
                if ((iVar6 == 0) &&
                   (iVar6 = xmlStrEqual((xmlChar *)pxVar3->size,"id"), pxVar17 = extraout_RDX_02,
                   iVar6 == 0)) goto LAB_00199e31;
              }
              else {
                iVar6 = xmlStrEqual(*(xmlChar **)(pxVar3[1].table + 1),
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                pxVar17 = extraout_RDX_01;
                if (iVar6 != 0) {
LAB_00199e31:
                  xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)pxVar3,pxVar17,(xmlAttrPtr)pxVar18)
                  ;
                }
              }
            }
            pxVar10 = xmlSchemaGetPropNode((xmlNodePtr)pxVar2,"id");
            if (pxVar10 != (xmlAttrPtr)0x0) {
              xmlSchemaPValAttrNodeID(ctxt,pxVar10);
            }
            pxVar8 = (xmlNodePtr)pxVar2->id;
            if (pxVar8 == (xmlNodePtr)0x0) {
              pxVar8 = (xmlNodePtr)0x0;
            }
            else if (((pxVar8->ns != (xmlNs *)0x0) &&
                     (iVar6 = xmlStrEqual(pxVar8->name,(xmlChar *)"annotation"), iVar6 != 0)) &&
                    (iVar6 = xmlStrEqual(pxVar8->ns->href,
                                         (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0)
                    ) {
              xmlSchemaParseAnnotation(ctxt,pxVar8,0);
              pxVar8 = pxVar8->next;
            }
            if (pxVar8 != (xmlNodePtr)0x0) {
              type_00 = (char *)0x0;
              uri = "(annotation?)";
              xmlSchemaPContentErr
                        (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar2,pxVar8,
                         (xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff38);
            }
            if (((ctxt->isRedefine == 0) ||
                (pxVar4 = ctxt->redef, pxVar4 == (xmlSchemaRedefPtr_conflict)0x0)) ||
               ((pxVar4->item->type != XML_SCHEMA_TYPE_ATTRIBUTEGROUP ||
                (((xmlSchemaTypePtr)local_a8._0_8_ != (xmlSchemaTypePtr)pxVar4->refName ||
                 ((xmlSchemaTypePtr)type != (xmlSchemaTypePtr)pxVar4->refTargetNs)))))) {
              item = (xmlSchemaAttributeUsePtr_conflict)
                     xmlSchemaNewQNameRef
                               (ctxt,XML_SCHEMA_TYPE_ATTRIBUTEGROUP,(xmlChar *)local_a8._0_8_,
                                (xmlChar *)type);
              if (item == (xmlSchemaAttributeUsePtr_conflict)0x0) {
                item = (xmlSchemaAttributeUsePtr_conflict)0x0;
                pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
                child = (xmlNodePtr *)local_a8._40_8_;
              }
              else {
                item->node = (xmlNodePtr)pxVar2;
                iVar6 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
                pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
                child = (xmlNodePtr *)local_a8._40_8_;
                if (iVar6 < 0) {
                  xmlSchemaPErrMemory(ctxt);
                  child = (xmlNodePtr *)local_a8._40_8_;
                }
              }
            }
            else if (ctxt->redefCounter == 0) {
              ctxt->redefCounter = 1;
              item = (xmlSchemaAttributeUsePtr_conflict)
                     xmlSchemaNewQNameRef
                               (ctxt,XML_SCHEMA_TYPE_ATTRIBUTEGROUP,(xmlChar *)local_a8._0_8_,
                                (xmlChar *)type);
              pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
              child = (xmlNodePtr *)local_a8._40_8_;
              if (item == (xmlSchemaAttributeUsePtr_conflict)0x0) {
                item = (xmlSchemaAttributeUsePtr_conflict)0x0;
              }
              else {
                item->node = (xmlNodePtr)pxVar2;
                ctxt->redef->reference = (xmlSchemaBasicItemPtr)item;
              }
            }
            else {
              local_a8._8_8_ = (xmlSchemaTypePtr)0x0;
              uri = (char *)xmlSchemaFormatQName
                                      ((xmlChar **)(local_a8 + 8),(xmlChar *)type,
                                       (xmlChar *)local_a8._0_8_);
              in_stack_ffffffffffffff48 = (xmlChar *)0x0;
              in_stack_ffffffffffffff38 = (char *)0x0;
              in_stack_ffffffffffffff40 = (xmlChar *)0x0;
              type = (char *)0x0;
              type_00 = 
              "The redefining attribute group definition \'%s\' must not contain more than one reference to the redefined definition"
              ;
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_SRC_REDEFINE,
                                  (xmlNodePtr)pxVar2,(xmlSchemaBasicItemPtr)0x0,
                                  "The redefining attribute group definition \'%s\' must not contain more than one reference to the redefined definition"
                                  ,(xmlChar *)uri,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
              pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
              if ((xmlSchemaTypePtr)local_a8._8_8_ != (xmlSchemaTypePtr)0x0) {
                (*xmlFree)((void *)local_a8._8_8_);
                local_a8._8_8_ = (xmlSchemaTypePtr)0x0;
              }
              item = (xmlSchemaAttributeUsePtr_conflict)0x0;
              child = (xmlNodePtr *)local_a8._40_8_;
            }
          }
          else {
            item = (xmlSchemaAttributeUsePtr_conflict)0x0;
            type = (char *)pxVar18;
            pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
            child = (xmlNodePtr *)local_a8._40_8_;
          }
        }
      }
      if ((hasRefs != (int *)0x0) && (item != (xmlSchemaAttributeUsePtr_conflict)0x0)) {
        *hasRefs = 1;
      }
    }
    else {
      pxVar2 = (xmlSchemaPtr)*child;
      type = (char *)pxVar11->next;
      local_a8._56_8_ = (xmlSchemaTypePtr)0x0;
      local_a8._0_8_ = (xmlSchemaTypePtr)0x0;
      local_a8._8_8_ = (xmlSchemaTypePtr)0x0;
      item = (xmlSchemaAttributeUsePtr_conflict)0x0;
      pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
      if (pxVar2 != (xmlSchemaPtr)0x0) {
        local_38 = (xmlSchemaTypePtr)type;
        pxVar8 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)pxVar2,"ref");
        if (pxVar8 == (xmlNodePtr)0x0) {
LAB_00199a48:
          local_3c = ctxt->nberrors;
          pxVar18 = (xmlSchemaTypePtr)pxVar2->notaDecl;
          local_a8._16_8_ = pxVar2;
          local_a8._24_8_ = hasRefs;
          if (pxVar18 == (xmlSchemaTypePtr)0x0) {
            local_a8._32_8_ = (xmlChar *)0x0;
            bVar21 = true;
            iVar15 = 2;
            iVar6 = 0;
            local_60 = (xmlSchemaTypePtr)0x0;
          }
          else {
            iVar15 = 2;
            local_60 = (xmlSchemaTypePtr)0x0;
            iVar6 = 0;
            local_64 = 0;
            local_a8._32_8_ = (xmlChar *)0x0;
            do {
              if ((xmlSchemaTypePtr)pxVar18->node == (xmlSchemaTypePtr)0x0) {
                if (pxVar8 == (xmlNodePtr)0x0) {
                  iVar7 = xmlStrEqual(pxVar18->name,"name");
                  if (iVar7 == 0) {
                    iVar7 = xmlStrEqual(pxVar18->name,"id");
                    if (iVar7 != 0) goto LAB_00199ade;
                    iVar7 = xmlStrEqual(pxVar18->name,"type");
                    if (iVar7 == 0) {
                      iVar7 = xmlStrEqual(pxVar18->name,"form");
                      if (iVar7 == 0) goto LAB_00199b72;
                      str1 = (xmlChar **)xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)pxVar18);
                      iVar7 = xmlStrEqual((xmlChar *)str1,"qualified");
                      if (iVar7 == 0) {
                        iVar7 = xmlStrEqual((xmlChar *)str1,(xmlChar *)"unqualified");
                        local_64 = 1;
                        if (iVar7 == 0) {
                          xVar19 = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
                          type_00 = "(qualified | unqualified)";
                          goto LAB_00199d32;
                        }
                      }
                      else {
                        local_60 = (xmlSchemaTypePtr)ctxt->targetNamespace;
                        local_64 = 1;
                      }
                    }
                    else {
                      type = (char *)xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)pxVar18);
                      type_00 = local_a8;
                      uri = local_a8 + 8;
                      xmlSchemaPValAttrNodeQNameValue
                                (ctxt,local_58,(xmlSchemaBasicItemPtr)pxVar18,(xmlAttrPtr)type,
                                 (xmlChar *)type_00,(xmlChar **)uri,
                                 (xmlChar **)in_stack_ffffffffffffff38);
                    }
                  }
                }
                else {
                  iVar7 = xmlStrEqual(pxVar18->name,"id");
                  if (iVar7 == 0) {
                    iVar7 = xmlStrEqual(pxVar18->name,"ref");
                    if (iVar7 == 0) {
LAB_00199b72:
                      iVar7 = xmlStrEqual(pxVar18->name,"use");
                      if (iVar7 == 0) {
                        iVar7 = xmlStrEqual(pxVar18->name,"default");
                        if (iVar7 == 0) {
                          iVar7 = xmlStrEqual(pxVar18->name,(xmlChar *)"fixed");
                          pxVar17 = extraout_RDX_00;
                          if (iVar7 == 0) goto LAB_00199ab4;
                          if ((xmlChar *)local_a8._32_8_ != (xmlChar *)0x0) goto LAB_00199c86;
                          local_a8._32_8_ = xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)pxVar18);
                          iVar6 = 2;
                        }
                        else if ((xmlChar *)local_a8._32_8_ == (xmlChar *)0x0) {
                          local_a8._32_8_ = xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)pxVar18);
                          iVar6 = 1;
                        }
                        else {
LAB_00199c86:
                          type_00 = "default";
                          uri = "fixed";
                          type = (char *)pxVar18;
                          xmlSchemaPMutualExclAttrErr
                                    (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_1,(xmlSchemaBasicItemPtr)0x0,
                                     (xmlAttrPtr)pxVar18,"default","fixed");
                        }
                      }
                      else {
                        str1 = (xmlChar **)xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)pxVar18);
                        iVar7 = xmlStrEqual((xmlChar *)str1,(xmlChar *)"optional");
                        if (iVar7 == 0) {
                          iVar7 = xmlStrEqual((xmlChar *)str1,(xmlChar *)"prohibited");
                          if (iVar7 == 0) {
                            iVar7 = xmlStrEqual((xmlChar *)str1,"required");
                            if (iVar7 == 0) {
                              xVar19 = XML_SCHEMAP_INVALID_ATTR_USE;
                              type_00 = "(optional | prohibited | required)";
LAB_00199d32:
                              in_stack_ffffffffffffff40 = (xmlChar *)0x0;
                              in_stack_ffffffffffffff38 = (char *)0x0;
                              type = (char *)0x0;
                              xmlSchemaPSimpleTypeErr
                                        (ctxt,xVar19,(xmlSchemaBasicItemPtr)pxVar18,(xmlNodePtr)0x0,
                                         (xmlSchemaTypePtr)type_00,(char *)str1,(xmlChar *)0x0,
                                         (char *)0x0,in_stack_ffffffffffffff48,
                                         (xmlChar *)CONCAT44(iVar6,parentType));
                              uri = (char *)str1;
                            }
                            else {
                              iVar15 = 1;
                            }
                          }
                          else {
                            iVar15 = 0;
                          }
                        }
                        else {
                          iVar15 = 2;
                        }
                      }
                    }
                  }
                  else {
LAB_00199ade:
                    xmlSchemaPValAttrNodeID(ctxt,(xmlAttrPtr)pxVar18);
                  }
                }
              }
              else {
                iVar7 = xmlStrEqual(((xmlSchemaTypePtr)pxVar18->node)->name,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                pxVar17 = extraout_RDX;
                if (iVar7 != 0) {
LAB_00199ab4:
                  xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)pxVar18,pxVar17,(xmlAttrPtr)type);
                }
              }
              pxVar18 = (xmlSchemaTypePtr)pxVar18->annot;
            } while (pxVar18 != (xmlSchemaTypePtr)0x0);
            bVar21 = local_64 == 0;
          }
          uVar5 = local_a8._16_8_;
          type = (char *)(ulong)(iVar15 != 2 && iVar6 == 1);
          if (iVar15 != 2 && iVar6 == 1) {
            in_stack_ffffffffffffff38 =
                 "The value of the attribute \'use\' must be \'optional\' if the attribute \'default\' is present"
            ;
            in_stack_ffffffffffffff40 = (xmlChar *)0x0;
            type = (char *)0x0;
            type_00 = "(optional | prohibited | required)";
            uri = (char *)0x0;
            xmlSchemaPSimpleTypeErr
                      (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_2,(xmlSchemaBasicItemPtr)local_a8._16_8_,
                       (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(optional | prohibited | required)",
                       (char *)0x0,
                       (xmlChar *)
                       "The value of the attribute \'use\' must be \'optional\' if the attribute \'default\' is present"
                       ,(char *)0x0,in_stack_ffffffffffffff48,(xmlChar *)CONCAT44(iVar6,parentType))
            ;
          }
          if (local_3c != ctxt->nberrors) goto LAB_0019a2fd;
          type = (char *)(ulong)(uint)parentType;
          local_50 = pxVar8;
          if (pxVar8 == (xmlNodePtr)0x0) {
            if ((bVar21) && ((local_58->flags & 2) != 0)) {
              local_60 = (xmlSchemaTypePtr)ctxt->targetNamespace;
            }
            iVar7 = xmlStrEqual((xmlChar *)local_60,
                                (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
            if (iVar7 != 0) {
              in_stack_ffffffffffffff38 = (char *)0x0;
              in_stack_ffffffffffffff40 = (xmlChar *)0x0;
              in_stack_ffffffffffffff48 = (xmlChar *)0x0;
              type = (char *)0x0;
              type_00 = "The target namespace must not match \'%s\'";
              uri = "http://www.w3.org/2001/XMLSchema-instance";
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_NO_XSI,
                                  (xmlNodePtr)uVar5,(xmlSchemaBasicItemPtr)0x0,
                                  "The target namespace must not match \'%s\'",
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance",
                                  (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            }
            pxVar10 = xmlSchemaGetPropNode((xmlNodePtr)uVar5,"name");
            if (pxVar10 == (xmlAttrPtr)0x0) {
              xmlSchemaPMissingAttrErr
                        (ctxt,(xmlParserErrors)uVar5,(xmlSchemaBasicItemPtr)0x1cc054,
                         (xmlNodePtr)type,type_00,uri);
LAB_0019a275:
              iVar7 = 1;
              item = (xmlSchemaAttributeUsePtr_conflict)0x0;
              type = (char *)(ulong)(uint)parentType;
            }
            else {
              pxVar18 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
              iVar7 = xmlSchemaPValAttrNode
                                (ctxt,(xmlSchemaBasicItemPtr)pxVar10,(xmlAttrPtr)pxVar18,
                                 (xmlSchemaTypePtr)(local_a8 + 0x38),(xmlChar **)type_00);
              if (iVar7 != 0) goto LAB_0019a275;
              iVar7 = xmlStrEqual((xmlChar *)local_a8._56_8_,"xmlns");
              uVar5 = local_a8._16_8_;
              if (iVar7 == 0) {
                if (iVar15 != 0) {
                  item = xmlSchemaAddAttributeUse(ctxt,(xmlNodePtr)local_a8._16_8_);
                  if (item == (xmlSchemaAttributeUsePtr_conflict)0x0) goto LAB_0019a1dd;
                  item->occurs = iVar15;
                  type_00 = (char *)0x0;
                  pxVar13 = xmlSchemaAddAttribute
                                      (ctxt,(xmlSchemaPtr)local_a8._56_8_,(xmlChar *)local_60,
                                       (xmlChar *)uVar5,(xmlNodePtr)0x0,(int)uri);
                  if (pxVar13 != (xmlSchemaAttributePtr_conflict)0x0) {
                    if ((xmlSchemaTypePtr)local_a8._8_8_ != (xmlSchemaTypePtr)0x0) {
                      pxVar13->typeName = (xmlChar *)local_a8._8_8_;
                      pxVar13->typeNs = (xmlChar *)local_a8._0_8_;
                    }
                    item->attrDecl = pxVar13;
                    iVar7 = 0;
                    type = (char *)(ulong)(uint)parentType;
                    if (((xmlChar *)local_a8._32_8_ != (xmlChar *)0x0) &&
                       (pxVar13->defValue = (xmlChar *)local_a8._32_8_, iVar6 == 2)) {
                      pbVar1 = (byte *)((long)&pxVar13->flags + 1);
                      *pbVar1 = *pbVar1 | 2;
                    }
                    goto LAB_0019a27f;
                  }
                  goto LAB_0019a1e0;
                }
                iVar7 = 5;
                item = (xmlSchemaAttributeUsePtr_conflict)0x0;
                type = (char *)(ulong)(uint)parentType;
              }
              else {
                pxVar18 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                in_stack_ffffffffffffff38 = "The value of the attribute must not match \'xmlns\'";
                in_stack_ffffffffffffff40 = (xmlChar *)0x0;
                type_00 = (char *)0x0;
                uri = (char *)0x0;
                xmlSchemaPSimpleTypeErr
                          (ctxt,XML_SCHEMAP_NO_XMLNS,(xmlSchemaBasicItemPtr)pxVar10,
                           (xmlNodePtr)pxVar18,(xmlSchemaTypePtr)0x0,(char *)0x0,
                           (xmlChar *)"The value of the attribute must not match \'xmlns\'",
                           (char *)0x0,in_stack_ffffffffffffff48,
                           (xmlChar *)CONCAT44(iVar6,parentType));
LAB_0019a1dd:
                item = (xmlSchemaAttributeUsePtr_conflict)0x0;
LAB_0019a1e0:
                type = (char *)(ulong)(uint)parentType;
                iVar7 = 1;
              }
            }
LAB_0019a27f:
            if ((iVar7 != 0) && (iVar7 != 5)) goto LAB_0019a2fd;
          }
          else {
            if (iVar15 != 0) {
              item = xmlSchemaAddAttributeUse(ctxt,(xmlNodePtr)uVar5);
              if (item != (xmlSchemaAttributeUsePtr_conflict)0x0) {
                iVar7 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
                if (iVar7 < 0) {
                  xmlSchemaPErrMemory(ctxt);
                }
                item->occurs = iVar15;
                type = (char *)local_a8._0_8_;
                pxVar9 = (xmlSchemaAttributePtr)
                         xmlSchemaNewQNameRef
                                   (ctxt,XML_SCHEMA_TYPE_ATTRIBUTE,(xmlChar *)local_a8._8_8_,
                                    (xmlChar *)local_a8._0_8_);
                if (pxVar9 != (xmlSchemaAttributePtr)0x0) {
                  item->attrDecl = pxVar9;
                  type = (char *)(ulong)(uint)parentType;
                  if ((xmlChar *)local_a8._32_8_ != (xmlChar *)0x0) {
                    item->defValue = (xmlChar *)local_a8._32_8_;
                  }
                  if (iVar6 == 2) {
                    *(byte *)&item->flags = (byte)item->flags | 1;
                  }
                  goto LAB_0019a288;
                }
              }
LAB_0019a2fd:
              item = (xmlSchemaAttributeUsePtr_conflict)0x0;
              hasRefs = (int *)local_a8._24_8_;
              pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
              goto LAB_0019a4ff;
            }
            item = (xmlSchemaAttributeUsePtr_conflict)0x0;
          }
LAB_0019a288:
          pxVar8 = local_50;
          hasRefs = (int *)local_a8._24_8_;
          uVar5 = local_a8._16_8_;
          pxVar18 = *(xmlSchemaTypePtr *)(local_a8._16_8_ + 0x18);
          if (iVar15 != 0) {
            if (pxVar18 == (xmlSchemaTypePtr)0x0) {
              pxVar18 = (xmlSchemaTypePtr)0x0;
            }
            else if ((((xmlSchemaTypePtr)pxVar18->node != (xmlSchemaTypePtr)0x0) &&
                     (iVar6 = xmlStrEqual(pxVar18->name,(xmlChar *)"annotation"), iVar6 != 0)) &&
                    (iVar6 = xmlStrEqual(((xmlSchemaTypePtr)pxVar18->node)->name,
                                         (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0)
                    ) {
              pxVar11 = xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)pxVar18,1);
              item->annot = pxVar11;
              pxVar18 = (xmlSchemaTypePtr)pxVar18->annot;
            }
            if (local_50 == (xmlNodePtr)0x0) {
              if (pxVar18 == (xmlSchemaTypePtr)0x0) {
                pxVar18 = (xmlSchemaTypePtr)0x0;
              }
              else if ((((xmlSchemaTypePtr)pxVar18->node != (xmlSchemaTypePtr)0x0) &&
                       (iVar6 = xmlStrEqual(pxVar18->name,"simpleType"), iVar6 != 0)) &&
                      (iVar6 = xmlStrEqual(((xmlSchemaTypePtr)pxVar18->node)->name,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar6 != 0)) {
                if (item->attrDecl->typeName == (xmlChar *)0x0) {
                  pxVar14 = xmlSchemaParseSimpleType(ctxt,local_58,(xmlNodePtr)pxVar18,0);
                  type = (char *)item->attrDecl;
                  ((xmlSchemaTypePtr)type)->base = (xmlChar *)pxVar14;
                }
                else {
                  type_00 = 
                  "The attribute \'type\' and the <simpleType> child are mutually exclusive";
                  uri = (char *)0x0;
                  type = (char *)pxVar18;
                  xmlSchemaPContentErr
                            (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_4,(xmlSchemaBasicItemPtr)local_a8._16_8_
                             ,(xmlNodePtr)pxVar18,
                             (xmlNodePtr)
                             "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                             ,(char *)0x0,in_stack_ffffffffffffff38);
                }
                pxVar18 = (xmlSchemaTypePtr)pxVar18->annot;
              }
              pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
              if (pxVar18 != (xmlSchemaTypePtr)0x0) {
                xVar19 = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
                uri = "(annotation?, simpleType?)";
                type = (char *)pxVar18;
                goto LAB_0019a742;
              }
            }
            else {
              pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
              if (pxVar18 != (xmlSchemaTypePtr)0x0) {
                if ((((xmlSchemaTypePtr)pxVar18->node == (xmlSchemaTypePtr)0x0) ||
                    (iVar6 = xmlStrEqual(pxVar18->name,"simpleType"), iVar6 == 0)) ||
                   (iVar6 = xmlStrEqual(((xmlSchemaTypePtr)pxVar18->node)->name,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
                {
                  xVar19 = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
                }
                else {
                  xVar19 = XML_SCHEMAP_SRC_ATTRIBUTE_3_2;
                }
                uri = "(annotation?)";
                type = (char *)pxVar18;
LAB_0019a742:
                type_00 = (char *)0x0;
                xmlSchemaPContentErr
                          (ctxt,xVar19,(xmlSchemaBasicItemPtr)local_a8._16_8_,(xmlNodePtr)type,
                           (xmlNodePtr)0x0,uri,in_stack_ffffffffffffff38);
                pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
              }
            }
            goto LAB_0019a4ff;
          }
          if (pxVar18 == (xmlSchemaTypePtr)0x0) {
            pxVar18 = (xmlSchemaTypePtr)0x0;
          }
          else if ((xmlSchemaTypePtr)pxVar18->node != (xmlSchemaTypePtr)0x0) {
            iVar6 = xmlStrEqual(pxVar18->name,(xmlChar *)"annotation");
            if ((iVar6 != 0) &&
               (iVar6 = xmlStrEqual(((xmlSchemaTypePtr)pxVar18->node)->name,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0)) {
              xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)pxVar18,0);
              pxVar18 = (xmlSchemaTypePtr)pxVar18->annot;
            }
            type = (char *)(ulong)(uint)parentType;
          }
          uVar16 = (uint)type;
          if (pxVar18 != (xmlSchemaTypePtr)0x0) {
            type_00 = (char *)0x0;
            uri = "(annotation?)";
            uVar16 = parentType;
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)uVar5,
                       (xmlNodePtr)pxVar18,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff38
                      );
            parentType = uVar16;
          }
          if (uVar16 == 0xd) {
            type = "Skipping attribute use prohibition, since it is pointless when extending a type"
            ;
          }
          else {
            if (uVar16 != 0x10) {
              if (pxVar8 == (xmlNodePtr)0x0) {
                local_a8._8_8_ = local_a8._56_8_;
                local_a8._0_8_ = local_60;
              }
              type = (char *)local_38;
              if ((local_38 != (xmlSchemaTypePtr)0x0) &&
                 (0 < (long)(int)*(xmlElementType *)&local_38->next)) {
                type = *(char **)local_38;
                lVar20 = 0;
                do {
                  type_00 = *(char **)((long)&((xmlSchemaTypePtr)type)->type + lVar20 * 8);
                  if (((((xmlSchemaTypePtr)type_00)->type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) &&
                      ((xmlSchemaTypePtr)local_a8._8_8_ ==
                       (xmlSchemaTypePtr)((xmlSchemaTypePtr)type_00)->name)) &&
                     ((xmlSchemaTypePtr)local_a8._0_8_ ==
                      (xmlSchemaTypePtr)((xmlSchemaTypePtr)type_00)->id)) {
                    local_48 = (xmlChar *)0x0;
                    type_00 = (char *)xmlSchemaFormatQName
                                                (&local_48,(xmlChar *)local_a8._0_8_,
                                                 (xmlChar *)local_a8._8_8_);
                    in_stack_ffffffffffffff38 = (char *)0x0;
                    type = "Skipping duplicate attribute use prohibition \'%s\'";
                    uri = (char *)0x0;
                    xmlSchemaCustomWarning
                              ((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
                               (xmlNodePtr)uVar5,
                               (xmlSchemaTypePtr)
                               "Skipping duplicate attribute use prohibition \'%s\'",type_00,
                               (xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffff40);
                    if (local_48 != (xmlChar *)0x0) {
                      (*xmlFree)(local_48);
                      local_48 = (xmlChar *)0x0;
                    }
                    goto LAB_0019a4f7;
                  }
                  lVar20 = lVar20 + 1;
                } while ((int)*(xmlElementType *)&local_38->next != lVar20);
              }
              item = (xmlSchemaAttributeUsePtr_conflict)xmlSchemaAddAttributeUseProhib(ctxt);
              if (item != (xmlSchemaAttributeUsePtr_conflict)0x0) {
                item->annot = (xmlSchemaAnnotPtr)local_a8._16_8_;
                item->next = (xmlSchemaAttributeUsePtr)local_a8._8_8_;
                item->attrDecl = (xmlSchemaAttributePtr)local_a8._0_8_;
                pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
                if ((pxVar8 != (xmlNodePtr)0x0) &&
                   (iVar6 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item),
                   pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_, iVar6 < 0)) {
                  xmlSchemaPErrMemory(ctxt);
                  pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
                }
                goto LAB_0019a4ff;
              }
              goto LAB_0019a4f7;
            }
            type = 
            "Skipping attribute use prohibition, since it is pointless inside an <attributeGroup>";
          }
          in_stack_ffffffffffffff38 = (char *)0x0;
          type_00 = (char *)0x0;
          uri = (char *)0x0;
          xmlSchemaCustomWarning
                    ((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
                     (xmlNodePtr)uVar5,(xmlSchemaTypePtr)type,(char *)0x0,(xmlChar *)0x0,
                     (xmlChar *)0x0,in_stack_ffffffffffffff40);
        }
        else {
          type = (char *)xmlSchemaGetNodeContent(ctxt,pxVar8);
          type_00 = local_a8;
          uri = local_a8 + 8;
          iVar6 = xmlSchemaPValAttrNodeQNameValue
                            (ctxt,local_58,(xmlSchemaBasicItemPtr)pxVar8,(xmlAttrPtr)type,
                             (xmlChar *)type_00,(xmlChar **)uri,
                             (xmlChar **)in_stack_ffffffffffffff38);
          if ((iVar6 == 0) &&
             (type = (char *)local_a8._0_8_,
             iVar6 = xmlSchemaCheckReference
                               (ctxt,pxVar2,pxVar8,(xmlAttrPtr)local_a8._0_8_,(xmlChar *)type_00),
             iVar6 == 0)) goto LAB_00199a48;
        }
LAB_0019a4f7:
        item = (xmlSchemaAttributeUsePtr_conflict)0x0;
        pxVar11 = (xmlSchemaAnnotPtr)local_a8._48_8_;
      }
    }
LAB_0019a4ff:
    if (item != (xmlSchemaAttributeUsePtr_conflict)0x0) {
      if ((xmlSchemaItemListPtr)pxVar11->next == (xmlSchemaItemListPtr)0x0) {
        pxVar12 = xmlSchemaItemListCreate();
        pxVar11->next = (_xmlSchemaAnnot *)pxVar12;
        if (pxVar12 == (xmlSchemaItemListPtr)0x0) {
          return -1;
        }
      }
      iVar6 = xmlSchemaItemListAddSize((xmlSchemaItemListPtr)pxVar11->next,2,item);
      if (iVar6 == -1) {
        return -1;
      }
    }
    *child = (*child)->next;
    list = (xmlSchemaItemListPtr *)type;
  } while( true );
}

Assistant:

static int
xmlSchemaParseLocalAttributes(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                        xmlNodePtr *child, xmlSchemaItemListPtr *list,
			int parentType, int *hasRefs)
{
    void *item;

    while ((IS_SCHEMA((*child), "attribute")) ||
           (IS_SCHEMA((*child), "attributeGroup"))) {
        if (IS_SCHEMA((*child), "attribute")) {
	    item = xmlSchemaParseLocalAttribute(ctxt, schema, *child,
		*list, parentType);
        } else {
            item = xmlSchemaParseAttributeGroupRef(ctxt, schema, *child);
	    if ((item != NULL) && (hasRefs != NULL))
		*hasRefs = 1;
        }
	if (item != NULL) {
	    if (*list == NULL) {
		/* TODO: Customize grow factor. */
		*list = xmlSchemaItemListCreate();
		if (*list == NULL)
		    return(-1);
	    }
	    if (xmlSchemaItemListAddSize(*list, 2, item) == -1)
		return(-1);
	}
        *child = (*child)->next;
    }
    return (0);
}